

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanTypeConversions.cpp
# Opt level: O1

VkShaderStageFlags Diligent::ShaderTypesToVkShaderStageFlags(SHADER_TYPE ShaderTypes)

{
  VkShaderStageFlagBits VVar1;
  VkShaderStageFlagBits VVar2;
  SHADER_TYPE ShaderType;
  bool bVar3;
  
  if (ShaderTypes == SHADER_TYPE_UNKNOWN) {
    VVar2 = 0;
  }
  else {
    VVar2 = 0;
    do {
      ShaderType = -ShaderTypes & ShaderTypes;
      VVar1 = ShaderTypeToVkShaderStageFlagBit(ShaderType);
      VVar2 = VVar2 | VVar1;
      bVar3 = ShaderType != ShaderTypes;
      ShaderTypes = ShaderType ^ ShaderTypes;
    } while (bVar3);
  }
  return VVar2;
}

Assistant:

VkShaderStageFlags ShaderTypesToVkShaderStageFlags(SHADER_TYPE ShaderTypes)
{
    VkShaderStageFlags Result = 0;
    while (ShaderTypes != SHADER_TYPE_UNKNOWN)
    {
        SHADER_TYPE Type = ExtractLSB(ShaderTypes);
        Result |= ShaderTypeToVkShaderStageFlagBit(Type);
    }
    return Result;
}